

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O1

void hyb_gga_xc_hse_sol_init(xc_func_type *p)

{
  int funcs_id [3];
  double funcs_coef [3];
  int local_38 [4];
  double local_28 [3];
  
  local_38[0] = 0x20e;
  local_38[1] = 0x20e;
  local_38[2] = 0x82;
  local_28[0] = 1.0;
  local_28[1] = -0.25;
  local_28[2] = 1.0;
  xc_mix_init(p,3,local_38,local_28);
  xc_hyb_init_sr(p,0.25,0.11);
  xc_func_set_ext_params_name(*p->func_aux,"_omega",0.0);
  xc_func_set_ext_params_name(p->func_aux[1],"_omega",p->cam_omega);
  return;
}

Assistant:

static void
hyb_gga_xc_hse_sol_init(xc_func_type *p)
{
  int   funcs_id  [3] = {XC_GGA_X_HJS_PBE_SOL, XC_GGA_X_HJS_PBE_SOL, XC_GGA_C_PBE};
  double funcs_coef[3] = {1.0, -0.25, 1.0};

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_sr(p, 0.25, 0.11);

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", p->cam_omega);
}